

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FeatureVectorizerValidator.cpp
# Opt level: O3

Result * CoreML::validate<(MLModelType)602>(Result *__return_storage_ptr__,Model *format)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  bool bVar3;
  FeatureVectorizer *pFVar4;
  Pipeline *pPVar5;
  Type *pTVar6;
  int index;
  vector<CoreML::Specification::FeatureType::TypeCase,_std::allocator<CoreML::Specification::FeatureType::TypeCase>_>
  *in_R8;
  ModelDescription *interface;
  initializer_list<CoreML::Specification::FeatureType::TypeCase> __l;
  initializer_list<CoreML::Specification::FeatureType::TypeCase> __l_00;
  allocator_type local_b1;
  pointer local_b0;
  _Alloc_hider local_a8;
  size_type local_a0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_98;
  vector<CoreML::Specification::FeatureType::TypeCase,_std::allocator<CoreML::Specification::FeatureType::TypeCase>_>
  local_88;
  undefined1 local_70 [8];
  _Alloc_hider local_68;
  undefined1 local_60 [24];
  TypeCase local_48 [6];
  
  interface = format->description_;
  if (interface == (ModelDescription *)0x0) {
    interface = (ModelDescription *)&Specification::_ModelDescription_default_instance_;
  }
  Result::Result((Result *)&local_b0);
  validateModelDescription((Result *)local_70,interface,format->specificationversion_);
  local_b0 = (pointer)local_70;
  std::__cxx11::string::operator=((string *)&local_a8,(string *)&local_68);
  pcVar2 = local_60 + 8;
  if (local_68._M_p != pcVar2) {
    operator_delete(local_68._M_p,local_60._8_8_ + 1);
  }
  bVar3 = Result::good((Result *)&local_b0);
  if (bVar3) {
    local_48[0] = kInt64Type;
    local_48[1] = kDoubleType;
    local_48[2] = kMultiArrayType;
    local_48[3] = kDictionaryType;
    __l._M_len = 4;
    __l._M_array = local_48;
    std::
    vector<CoreML::Specification::FeatureType::TypeCase,_std::allocator<CoreML::Specification::FeatureType::TypeCase>_>
    ::vector(&local_88,__l,&local_b1);
    validateDescriptionsContainFeatureWithTypes<google::protobuf::RepeatedPtrField<CoreML::Specification::FeatureDescription>>
              ((Result *)local_70,(CoreML *)&interface->input_,
               (RepeatedPtrField<CoreML::Specification::FeatureDescription> *)0x0,(int)&local_88,
               in_R8);
    local_b0 = (pointer)local_70;
    std::__cxx11::string::operator=((string *)&local_a8,(string *)&local_68);
    if (local_68._M_p != pcVar2) {
      operator_delete(local_68._M_p,local_60._8_8_ + 1);
    }
    if (local_88.
        super__Vector_base<CoreML::Specification::FeatureType::TypeCase,_std::allocator<CoreML::Specification::FeatureType::TypeCase>_>
        ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_88.
                      super__Vector_base<CoreML::Specification::FeatureType::TypeCase,_std::allocator<CoreML::Specification::FeatureType::TypeCase>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      (long)local_88.
                            super__Vector_base<CoreML::Specification::FeatureType::TypeCase,_std::allocator<CoreML::Specification::FeatureType::TypeCase>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_88.
                            super__Vector_base<CoreML::Specification::FeatureType::TypeCase,_std::allocator<CoreML::Specification::FeatureType::TypeCase>_>
                            ._M_impl.super__Vector_impl_data._M_start);
    }
    bVar3 = Result::good((Result *)&local_b0);
    if (bVar3) {
      local_48[0] = 5;
      __l_00._M_len = 1;
      __l_00._M_array = local_48;
      std::
      vector<CoreML::Specification::FeatureType::TypeCase,_std::allocator<CoreML::Specification::FeatureType::TypeCase>_>
      ::vector(&local_88,__l_00,&local_b1);
      validateDescriptionsContainFeatureWithTypes<google::protobuf::RepeatedPtrField<CoreML::Specification::FeatureDescription>>
                ((Result *)local_70,(CoreML *)&interface->output_,
                 (RepeatedPtrField<CoreML::Specification::FeatureDescription> *)0x1,(int)&local_88,
                 in_R8);
      local_b0 = (pointer)local_70;
      std::__cxx11::string::operator=((string *)&local_a8,(string *)&local_68);
      if (local_68._M_p != pcVar2) {
        operator_delete(local_68._M_p,local_60._8_8_ + 1);
      }
      if (local_88.
          super__Vector_base<CoreML::Specification::FeatureType::TypeCase,_std::allocator<CoreML::Specification::FeatureType::TypeCase>_>
          ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_88.
                        super__Vector_base<CoreML::Specification::FeatureType::TypeCase,_std::allocator<CoreML::Specification::FeatureType::TypeCase>_>
                        ._M_impl.super__Vector_impl_data._M_start,
                        (long)local_88.
                              super__Vector_base<CoreML::Specification::FeatureType::TypeCase,_std::allocator<CoreML::Specification::FeatureType::TypeCase>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_88.
                              super__Vector_base<CoreML::Specification::FeatureType::TypeCase,_std::allocator<CoreML::Specification::FeatureType::TypeCase>_>
                              ._M_impl.super__Vector_impl_data._M_start);
      }
      bVar3 = Result::good((Result *)&local_b0);
      if (bVar3) {
        index = 0;
        while( true ) {
          if (format->_oneof_case_[0] == 0x25a) {
            pFVar4 = (FeatureVectorizer *)(format->Type_).pipelineclassifier_;
          }
          else {
            pFVar4 = Specification::FeatureVectorizer::default_instance();
          }
          if ((pFVar4->inputlist_).super_RepeatedPtrFieldBase.current_size_ <= index) break;
          if (format->_oneof_case_[0] == 0x25a) {
            pPVar5 = (format->Type_).pipeline_;
          }
          else {
            pPVar5 = (Pipeline *)Specification::FeatureVectorizer::default_instance();
          }
          pTVar6 = google::protobuf::internal::RepeatedPtrFieldBase::
                   Get<google::protobuf::RepeatedPtrField<CoreML::Specification::FeatureVectorizer_InputColumn>::TypeHandler>
                             ((RepeatedPtrFieldBase *)&pPVar5->models_,index);
          index = index + 1;
          if (pTVar6->inputdimensions_ == 0) {
            local_70 = (undefined1  [8])local_60;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)local_70,"Dimension size must be greater tha zero.","");
            Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,(string *)local_70);
            if (local_70 != (undefined1  [8])local_60) {
              operator_delete((void *)local_70,local_60._0_8_ + 1);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_a8._M_p == &local_98) {
              return __return_storage_ptr__;
            }
            operator_delete(local_a8._M_p,local_98._M_allocated_capacity + 1);
            return __return_storage_ptr__;
          }
        }
      }
    }
  }
  *(pointer *)__return_storage_ptr__ = local_b0;
  paVar1 = &(__return_storage_ptr__->m_message).field_2;
  (__return_storage_ptr__->m_message)._M_dataplus._M_p = (pointer)paVar1;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a8._M_p == &local_98) {
    paVar1->_M_allocated_capacity = local_98._M_allocated_capacity;
    *(undefined8 *)((long)&(__return_storage_ptr__->m_message).field_2 + 8) = local_98._8_8_;
  }
  else {
    (__return_storage_ptr__->m_message)._M_dataplus._M_p = local_a8._M_p;
    (__return_storage_ptr__->m_message).field_2._M_allocated_capacity =
         local_98._M_allocated_capacity;
  }
  (__return_storage_ptr__->m_message)._M_string_length = local_a0;
  return __return_storage_ptr__;
}

Assistant:

Result validate<MLModelType_featureVectorizer>(const Specification::Model& format) {
        const auto& interface = format.description();
        
        Result result;
        
            // Validate its a MLModel type.
        result = validateModelDescription(interface, format.specificationversion());
        if (!result.good()) {
            return result;
        }
        
            // Validate the inputs
        result = validateDescriptionsContainFeatureWithTypes(interface.input(),
                                                             0,
                                                             {Specification::FeatureType::kInt64Type,
                                                                 Specification::FeatureType::kDoubleType,
                                                                 Specification::FeatureType::kMultiArrayType,
                                                                 Specification::FeatureType::kDictionaryType});
        if (!result.good()) {
            return result;
        }
        
            // Validate the outputs
        result = validateDescriptionsContainFeatureWithTypes(interface.output(), 1, {Specification::FeatureType::kMultiArrayType});
        if (!result.good()) {
            return result;
        }
        
            // Validate the parameters
        for (int i = 0; i < format.featurevectorizer().inputlist_size(); i++) {
            auto& element = format.featurevectorizer().inputlist(i);
            auto size = element.inputdimensions();
            if (size <= 0) {
                return Result(ResultType::INVALID_MODEL_PARAMETERS,
                              "Dimension size must be greater tha zero.");
            }
        }
        
        return result;
    }